

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutablePriorityQueue.h
# Opt level: O3

int __thiscall
CMU462::MutablePriorityQueue<CMU462::EdgeRecord>::remove
          (MutablePriorityQueue<CMU462::EdgeRecord> *this,char *__filename)

{
  int extraout_EAX;
  iterator iVar1;
  pair<std::_Rb_tree_iterator<CMU462::EdgeRecord>,_std::_Rb_tree_iterator<CMU462::EdgeRecord>_>
  pVar2;
  
  iVar1 = std::
          _Rb_tree<CMU462::EdgeRecord,_CMU462::EdgeRecord,_std::_Identity<CMU462::EdgeRecord>,_std::less<CMU462::EdgeRecord>,_std::allocator<CMU462::EdgeRecord>_>
          ::find((_Rb_tree<CMU462::EdgeRecord,_CMU462::EdgeRecord,_std::_Identity<CMU462::EdgeRecord>,_std::less<CMU462::EdgeRecord>,_std::allocator<CMU462::EdgeRecord>_>
                  *)this,(key_type *)__filename);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->queue)._M_t._M_impl.super__Rb_tree_header) {
    pVar2 = std::
            _Rb_tree<CMU462::EdgeRecord,_CMU462::EdgeRecord,_std::_Identity<CMU462::EdgeRecord>,_std::less<CMU462::EdgeRecord>,_std::allocator<CMU462::EdgeRecord>_>
            ::equal_range((_Rb_tree<CMU462::EdgeRecord,_CMU462::EdgeRecord,_std::_Identity<CMU462::EdgeRecord>,_std::less<CMU462::EdgeRecord>,_std::allocator<CMU462::EdgeRecord>_>
                           *)this,(key_type *)__filename);
    std::
    _Rb_tree<CMU462::EdgeRecord,_CMU462::EdgeRecord,_std::_Identity<CMU462::EdgeRecord>,_std::less<CMU462::EdgeRecord>,_std::allocator<CMU462::EdgeRecord>_>
    ::_M_erase_aux((_Rb_tree<CMU462::EdgeRecord,_CMU462::EdgeRecord,_std::_Identity<CMU462::EdgeRecord>,_std::less<CMU462::EdgeRecord>,_std::allocator<CMU462::EdgeRecord>_>
                    *)this,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node);
    return extraout_EAX;
  }
  return (int)iVar1._M_node;
}

Assistant:

void remove(const T& item) {
    if (queue.find(item) != queue.end()) {
      queue.erase(item);
    }
  }